

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdeadlinetimer.cpp
# Opt level: O3

qint64 __thiscall QDeadlineTimer::rawRemainingTimeNSecs(QDeadlineTimer *this)

{
  long lVar1;
  qint64 qVar2;
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  qVar2 = -1;
  if (!SBORROW8(this->t1,lVar1)) {
    qVar2 = this->t1 - lVar1;
  }
  return qVar2;
}

Assistant:

qint64 QDeadlineTimer::rawRemainingTimeNSecs() const noexcept
{
    if (t1 == std::numeric_limits<qint64>::min())
        return t1;          // we'd saturate to this anyway

    QDeadlineTimer now = current(timerType());
    qint64 r;
    if (qSubOverflow(t1, now.t1, &r))
        return -1;      // any negative number is fine
    return r;
}